

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::NegativeGLSLCompileTime::Shader1_abi_cxx11_
          (string *__return_storage_ptr__,NegativeGLSLCompileTime *this,int binding)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190;
  int local_14;
  string *psStack_10;
  int binding_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(&local_190,"\nlayout(binding = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  std::operator<<(poVar1,") buffer Buffer {\n  int x;\n};\nvoid main() {\n  x = 0;\n}");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string Shader1(int binding)
	{
		std::stringstream ss;
		ss << NL "layout(binding = " << binding
		   << ") buffer Buffer {" NL "  int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}";
		return ss.str();
	}